

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFileTest.cpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
EvilConfig::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          EvilConfig *this,istream *param_1)

{
  FileError *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (FileError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"evil",&local_39);
  CLI::FileError::FileError(this_00,&local_38);
  __cxa_throw(this_00,&CLI::FileError::typeinfo,CLI::Error::~Error);
}

Assistant:

std::vector<CLI::ConfigItem> from_config(std::istream &) const override { throw CLI::FileError("evil"); }